

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locmap.cpp
# Opt level: O0

int32_t idCmp(char *id1,char *id2)

{
  bool bVar1;
  int local_1c;
  char *pcStack_18;
  int32_t diffIdx;
  char *id2_local;
  char *id1_local;
  
  local_1c = 0;
  pcStack_18 = id2;
  id2_local = id1;
  while( true ) {
    bVar1 = false;
    if (*id2_local == *pcStack_18) {
      bVar1 = *id2_local != '\0';
    }
    if (!bVar1) break;
    local_1c = local_1c + 1;
    id2_local = id2_local + 1;
    pcStack_18 = pcStack_18 + 1;
  }
  return local_1c;
}

Assistant:

static int32_t
idCmp(const char* id1, const char* id2)
{
    int32_t diffIdx = 0;
    while (*id1 == *id2 && *id1 != 0) {
        diffIdx++;
        id1++;
        id2++;
    }
    return diffIdx;
}